

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_main.c
# Opt level: O1

int main(int argc,char **argv)

{
  FILE *errors;
  int iVar1;
  CURLcode CVar2;
  char *fmt;
  int fd [2];
  GlobalConfig global;
  uint local_90 [2];
  GlobalConfig local_88;
  
  local_88.first = (OperationConfig *)0x0;
  local_88.current = (OperationConfig *)0x0;
  local_88.libcurl = (char *)0x0;
  local_88.fail_early = false;
  local_88.styled_output = false;
  local_88._74_6_ = 0;
  local_88.trace_fopened = false;
  local_88._49_3_ = 0;
  local_88.tracetype = TRACE_NONE;
  local_88.tracetime = false;
  local_88._57_3_ = 0;
  local_88.progressmode = 0;
  local_88.trace_dump = (char *)0x0;
  local_88.trace_stream = (FILE *)0x0;
  local_88.errors = (FILE *)0x0;
  local_88.errors_fopened = false;
  local_88._25_7_ = 0;
  local_88.easy = (CURL *)0x0;
  local_88.showerror = 0;
  local_88.mute = false;
  local_88.noprogress = false;
  local_88.isatty = false;
  local_88._15_1_ = 0;
  local_88.last = (OperationConfig *)0x0;
  local_90[0] = 0;
  local_90[1] = 0;
  do {
    if ((2 < local_90[0]) && (2 < local_90[1])) {
      close(local_90[0]);
      close(local_90[1]);
      break;
    }
    iVar1 = pipe((int *)local_90);
  } while (-1 < iVar1);
  signal(0xd,(__sighandler_t)0x1);
  errors = _stderr;
  local_88.showerror = -1;
  local_88.errors = (FILE *)_stderr;
  local_88.styled_output = true;
  local_88.first = (OperationConfig *)malloc(0x4a0);
  local_88.last = local_88.first;
  if (local_88.first == (OperationConfig *)0x0) {
    helpf((FILE *)errors,"error initializing curl\n");
LAB_00113521:
    CVar2 = CURLE_FAILED_INIT;
  }
  else {
    CVar2 = curl_global_init(3);
    if (CVar2 == CURLE_OK) {
      CVar2 = get_libcurl_info();
      if (CVar2 == CURLE_OK) {
        local_88.easy = (CURL *)curl_easy_init();
        if (local_88.easy != (CURL *)0x0) {
          config_init(local_88.first);
          (local_88.first)->easy = local_88.easy;
          (local_88.first)->global = &local_88;
          CVar2 = CURLE_OK;
          goto LAB_00113554;
        }
        helpf((FILE *)_stderr,"error initializing curl easy handle\n");
        free(local_88.first);
        goto LAB_00113521;
      }
      fmt = "error retrieving curl library information\n";
    }
    else {
      fmt = "error initializing curl library\n";
    }
    helpf((FILE *)_stderr,fmt);
    free(local_88.first);
  }
LAB_00113554:
  if (CVar2 == CURLE_OK) {
    CVar2 = operate(&local_88,argc,argv);
    curl_easy_cleanup(local_88.easy);
    local_88.easy = (CURL *)0x0;
    curl_global_cleanup();
    free(local_88.trace_dump);
    local_88.trace_dump = (char *)0x0;
    if ((local_88.errors_fopened == true) && ((FILE *)local_88.errors != (FILE *)0x0)) {
      fclose((FILE *)local_88.errors);
    }
    local_88.errors = (FILE *)0x0;
    if ((local_88.trace_fopened == true) && ((FILE *)local_88.trace_stream != (FILE *)0x0)) {
      fclose((FILE *)local_88.trace_stream);
    }
    local_88.trace_stream = (FILE *)0x0;
    free(local_88.libcurl);
    local_88.libcurl = (char *)0x0;
    config_free(local_88.last);
  }
  return CVar2;
}

Assistant:

int main(int argc, char *argv[])
{
  CURLcode result = CURLE_OK;
  struct GlobalConfig global;
  memset(&global, 0, sizeof(global));

  /* Perform any platform-specific terminal configuration */
  configure_terminal();

  main_checkfds();

#if defined(HAVE_SIGNAL) && defined(SIGPIPE)
  (void)signal(SIGPIPE, SIG_IGN);
#endif

  /* Initialize memory tracking */
  memory_tracking_init();

  /* Initialize the curl library - do not call any libcurl functions before
     this point */
  result = main_init(&global);

#ifdef WIN32
  /* Undocumented diagnostic option to list the full paths of all loaded
     modules, regardless of whether or not initialization succeeded. */
  if(argc == 2 && !strcmp(argv[1], "--dump-module-paths")) {
    struct curl_slist *item, *head = GetLoadedModulePaths();
    for(item = head; item; item = item->next) {
      printf("%s\n", item->data);
    }
    curl_slist_free_all(head);
    if(!result)
      main_free(&global);
  }
  else
#endif /* WIN32 */
  if(!result) {
    /* Start our curl operation */
    result = operate(&global, argc, argv);

#ifdef __SYMBIAN32__
    if(global.showerror)
      tool_pressanykey();
#endif

    /* Perform the main cleanup */
    main_free(&global);
  }

  /* Return the terminal to its original state */
  restore_terminal();

#ifdef __NOVELL_LIBC__
  if(getenv("_IN_NETWARE_BASH_") == NULL)
    tool_pressanykey();
#endif

#ifdef __VMS
  vms_special_exit(result, vms_show);
#else
  return (int)result;
#endif
}